

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_track.h
# Opt level: O2

ssize_t __thiscall
event_track::EventMessageInstanceBox::write
          (EventMessageInstanceBox *this,int __fd,void *__buf,size_t __n)

{
  size_type sVar1;
  size_type sVar2;
  int iVar3;
  size_t sVar4;
  pointer puVar5;
  pointer puVar6;
  uint uVar7;
  char acVar8 [4];
  undefined4 in_register_00000034;
  char *pcVar9;
  char cVar10;
  int k;
  pointer puVar11;
  ulong uVar12;
  char int_buf [4];
  char long_buf [8];
  
  pcVar9 = (char *)CONCAT44(in_register_00000034,__fd);
  iVar3 = std::__cxx11::string::compare((char *)&this->scheme_id_uri_);
  sVar4 = size(this);
  uVar7 = (uint)sVar4;
  int_buf = (char  [4])
            (uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18);
  std::ostream::write(pcVar9,(long)int_buf);
  cVar10 = (char)__fd;
  if (iVar3 == 0) {
    std::ostream::put(cVar10);
    std::ostream::put(cVar10);
    std::ostream::put(cVar10);
    std::ostream::put(cVar10);
    uVar7 = (*(int *)&(this->message_data_).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish -
            *(int *)&(this->message_data_).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start) + 8;
    acVar8 = (char  [4])
             (uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 * 0x1000000);
    int_buf = acVar8;
    std::ostream::write(pcVar9,(long)int_buf);
    std::ostream::put(cVar10);
    std::ostream::put(cVar10);
    std::ostream::put(cVar10);
    std::ostream::put(cVar10);
    puVar6 = (this->message_data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar5 = (this->message_data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar5 != puVar6) {
      for (uVar12 = 0; uVar12 < (ulong)((long)puVar5 - (long)puVar6); uVar12 = uVar12 + 1) {
        std::ostream::put(cVar10);
        puVar6 = (this->message_data_).
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        puVar5 = (this->message_data_).
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      }
    }
    int_buf = acVar8;
    std::ostream::write(pcVar9,(long)int_buf);
    std::ostream::put(cVar10);
    std::ostream::put(cVar10);
    std::ostream::put(cVar10);
    std::ostream::put(cVar10);
    puVar6 = (this->message_data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar12 = 0x10;
    if ((this->message_data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_finish != puVar6) {
      std::ostream::write(pcVar9,(long)puVar6);
    }
  }
  else {
    std::ostream::put(cVar10);
    std::ostream::put(cVar10);
    std::ostream::put(cVar10);
    std::ostream::put(cVar10);
    std::ostream::put(cVar10);
    std::ostream::put(cVar10);
    std::ostream::put(cVar10);
    std::ostream::put(cVar10);
    int_buf[0] = '\0';
    int_buf[1] = '\0';
    int_buf[2] = '\0';
    int_buf[3] = '\0';
    std::ostream::write(pcVar9,(long)int_buf);
    uVar12 = this->presentation_time_delta_;
    long_buf = (char  [8])
               (uVar12 >> 0x38 | (uVar12 & 0xff000000000000) >> 0x28 |
                (uVar12 & 0xff0000000000) >> 0x18 | (uVar12 & 0xff00000000) >> 8 |
                (uVar12 & 0xff000000) << 8 | (uVar12 & 0xff0000) << 0x18 | (uVar12 & 0xff00) << 0x28
               | uVar12 << 0x38);
    std::ostream::write(pcVar9,(long)long_buf);
    uVar7 = this->event_duration_;
    int_buf = (char  [4])
              (uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18);
    std::ostream::write(pcVar9,(long)int_buf);
    uVar7 = this->id_;
    int_buf = (char  [4])
              (uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18);
    std::ostream::write(pcVar9,(long)int_buf);
    std::ostream::write(pcVar9,(long)(this->scheme_id_uri_)._M_dataplus._M_p);
    sVar1 = (this->scheme_id_uri_)._M_string_length;
    std::ostream::write(pcVar9,(long)(this->value_)._M_dataplus._M_p);
    sVar2 = (this->value_)._M_string_length;
    puVar6 = (this->message_data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar5 = (this->message_data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    puVar11 = puVar5;
    if (puVar5 != puVar6) {
      std::ostream::write(pcVar9,(long)puVar6);
      puVar5 = (this->message_data_).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      puVar11 = (this->message_data_).
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish;
    }
    uVar12 = (ulong)((((int)puVar11 + (int)sVar2 + (int)sVar1) - (int)puVar5) + 0x22);
  }
  return uVar12;
}

Assistant:

size_t write(std::ostream &ostr)
		{
			char int_buf[4];
			char long_buf[8];
			uint32_t bytes_written = 0;

			// write as webvtt
			if (scheme_id_uri_.compare("urn:webvtt") == 0) 
			{
				uint32_t sz = (uint32_t)this->size();
				fmp4_write_uint32(sz, int_buf);
				ostr.write((char*)int_buf, 4);
				bytes_written += 4;

				ostr.put('v');
				ostr.put('t');
				ostr.put('t');
				ostr.put('c');
				bytes_written += 4;

				sz = message_data_.size() + 8;
				fmp4_write_uint32(sz, int_buf);
				ostr.write((char*)int_buf, 4);
				bytes_written += 4;
				ostr.put('i');
				ostr.put('d');
				ostr.put('e');
				ostr.put('n');

				if (message_data_.size())
				{
					for (int k = 0; k < message_data_.size(); k++)
                    {
					   char c = (char) message_data_[k];
					   if (c != ' ')
					      ostr.put(c);
					   else 
						  ostr.put('-');

					}					
				}
					

				fmp4_write_uint32(sz, int_buf);
				ostr.write((char*)int_buf, 4);
				bytes_written += 4;

				ostr.put('p');
				ostr.put('a');
				ostr.put('y');
				ostr.put('l');

				if (message_data_.size())
					ostr.write((char*)&message_data_[0], message_data_.size());

			}
			else {
				uint32_t sz = (uint32_t)this->size();
				fmp4_write_uint32(sz, int_buf);
				ostr.write((char*)int_buf, 4);
				bytes_written += 4;

				ostr.put('e');
				ostr.put('m');
				ostr.put('i');
				ostr.put('b');
				bytes_written += 4;
				ostr.put((uint8_t)0);
				ostr.put(0u);
				ostr.put(0u);
				ostr.put(0u);
				bytes_written += 4;

				fmp4_write_uint32(0, int_buf);
				ostr.write(int_buf, 4);
				bytes_written += 4;
				fmp4_write_int64(presentation_time_delta_, long_buf);
				ostr.write(long_buf, 8);
				bytes_written += 8;
				fmp4_write_uint32(event_duration_, int_buf);
				ostr.write(int_buf, 4);
				bytes_written += 4;
				fmp4_write_uint32(id_, int_buf);
				ostr.write(int_buf, 4);
				bytes_written += 4;
				ostr.write(scheme_id_uri_.c_str(), scheme_id_uri_.size() + 1);
				bytes_written += (uint32_t)scheme_id_uri_.size() + 1;
				ostr.write(value_.c_str(), value_.size() + 1);
				bytes_written += (uint32_t)value_.size() + 1;

				if (message_data_.size())
					ostr.write((char*)&message_data_[0], message_data_.size());

				bytes_written += (uint32_t)message_data_.size();
			}
			return bytes_written;
		}